

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_divide(void *pA,void *pB,void *pC,Integer nelems,Integer type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  double dVar9;
  double dVar10;
  double x2;
  double x1;
  double bImag;
  double bReal;
  double aImag;
  double aReal;
  Integer i;
  Integer in_stack_00000108;
  char *in_stack_00000110;
  double local_80;
  double local_70;
  long local_30;
  
  switch(in_R8) {
  case 0x3e9:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(int *)(in_RSI + local_30 * 4) == 0) {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
      else {
        *(int *)(in_RDX + local_30 * 4) =
             *(int *)(in_RDI + local_30 * 4) / *(int *)(in_RSI + local_30 * 4);
      }
    }
    break;
  case 0x3ea:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(long *)(in_RSI + local_30 * 8) == 0) {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
      else {
        *(long *)(in_RDX + local_30 * 8) =
             *(long *)(in_RDI + local_30 * 8) / *(long *)(in_RSI + local_30 * 8);
      }
    }
    break;
  case 0x3eb:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RSI + local_30 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        *(float *)(in_RDX + local_30 * 4) =
             *(float *)(in_RDI + local_30 * 4) / *(float *)(in_RSI + local_30 * 4);
      }
      else {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
    }
    break;
  case 0x3ec:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      dVar5 = *(double *)(in_RSI + local_30 * 8);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        *(double *)(in_RDX + local_30 * 8) =
             *(double *)(in_RDI + local_30 * 8) / *(double *)(in_RSI + local_30 * 8);
      }
      else {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
    }
    break;
  default:
    pnga_error(in_stack_00000110,in_stack_00000108);
    break;
  case 0x3ee:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RDI + local_30 * 8);
      fVar2 = *(float *)(in_RSI + local_30 * 8);
      fVar3 = *(float *)(in_RDI + 4 + local_30 * 8);
      fVar4 = *(float *)(in_RSI + 4 + local_30 * 8);
      fVar8 = fVar2;
      if (fVar2 < 0.0) {
        fVar8 = -fVar2;
      }
      fVar7 = fVar4;
      if (fVar4 < 0.0) {
        fVar7 = -fVar4;
      }
      if (fVar8 < fVar7) {
        fVar2 = fVar2 / fVar4;
        fVar4 = 1.0 / (fVar4 * (fVar2 * fVar2 + 1.0));
        *(float *)(in_RDX + local_30 * 8) = (fVar1 * fVar2 + fVar3) * fVar4;
        *(float *)(in_RDX + 4 + local_30 * 8) = (fVar3 * fVar2 + -fVar1) * fVar4;
      }
      else if ((fVar2 != 0.0) || (NAN(fVar2))) {
        fVar4 = fVar4 / fVar2;
        fVar2 = 1.0 / (fVar2 * (fVar4 * fVar4 + 1.0));
        *(float *)(in_RDX + local_30 * 8) = (fVar3 * fVar4 + fVar1) * fVar2;
        *(float *)(in_RDX + 4 + local_30 * 8) = (-fVar1 * fVar4 + fVar3) * fVar2;
      }
      else {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
    }
    break;
  case 0x3ef:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      dVar5 = *(double *)(in_RDI + local_30 * 0x10);
      dVar10 = *(double *)(in_RSI + local_30 * 0x10);
      dVar6 = *(double *)(in_RDI + local_30 * 0x10 + 8);
      dVar9 = *(double *)(in_RSI + local_30 * 0x10 + 8);
      local_70 = dVar10;
      if (dVar10 < 0.0) {
        local_70 = -dVar10;
      }
      local_80 = dVar9;
      if (dVar9 < 0.0) {
        local_80 = -dVar9;
      }
      if (local_70 < local_80) {
        dVar10 = dVar10 / dVar9;
        dVar9 = 1.0 / (dVar9 * (dVar10 * dVar10 + 1.0));
        *(double *)(in_RDX + local_30 * 0x10) = (dVar5 * dVar10 + dVar6) * dVar9;
        *(double *)(in_RDX + local_30 * 0x10 + 8) = (dVar6 * dVar10 + -dVar5) * dVar9;
      }
      else if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar9 = dVar9 / dVar10;
        dVar10 = 1.0 / (dVar10 * (dVar9 * dVar9 + 1.0));
        *(double *)(in_RDX + local_30 * 0x10) = (dVar6 * dVar9 + dVar5) * dVar10;
        *(double *)(in_RDX + local_30 * 0x10 + 8) = (-dVar5 * dVar9 + dVar6) * dVar10;
      }
      else {
        pnga_error(in_stack_00000110,in_stack_00000108);
      }
    }
  }
  return;
}

Assistant:

static void do_divide(void *pA, void *pB, void *pC, Integer nelems, Integer type){
  /* 
    Modified by Doug Baxter to call ga_error on divide by 0.
    A do_step_divide is added below to return properly signed
    infinity for the step_max functions.
  */
  Integer i;
  double aReal, aImag, bReal, bImag;
  double x1,x2;

  switch(type){
  
  case C_DBL:
    for(i = 0; i<nelems; i++) {
      if(((double*)pB)[i]!=(double)0.0)
	((double*)pC)[i]=  ((double*)pA)[i]/((double*)pB)[i];
      else{
	pnga_error("zero divisor ",((double*)pB)[i]); 
      }
    }
    break;
  case C_DCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((DoubleComplex*)pA)[i].real;
      bReal = ((DoubleComplex*)pB)[i].real;
      aImag = ((DoubleComplex*)pA)[i].imag;
      bImag = ((DoubleComplex*)pB)[i].imag;
      /* 
        The following original algorithm overflows
	when it need not.
      temp = bReal*bReal+bImag*bImag;
      if(temp!=0.0){
	((DoubleComplex*)pC)[i].real
	  =(aReal*bReal+aImag*bImag)/temp;
	((DoubleComplex*)pC)[i].imag
	  =(aImag*bReal-aReal*bImag)/temp;
      }
      else{
	pnga_error("zero divisor ",temp); 
      }
      */
      if (GA_ABS(bReal) >= GA_ABS(bImag)) {
	if (bReal != (double)0.0) {
	  x1 = bImag/bReal;
          /* So x1 <= 1 */
	  x2 = ((double)1.0)/(bReal*(((double)1.0)+(x1*x1)));
	  ((DoubleComplex*)pC)[i].real = (aReal + aImag*x1)*x2;
	  ((DoubleComplex*)pC)[i].imag = (aImag - aReal*x1)*x2;
	}
	else{
	  pnga_error("zero divisor ",bReal); 
	}
      } else {
	x1 = bReal/bImag;
        /* So x1 <= 1 */
	x2 = ((double)1.0)/(bImag*(((double)1.0)+(x1*x1)));
	((DoubleComplex*)pC)[i].real = (aReal*x1 + aImag)*x2;
	((DoubleComplex*)pC)[i].imag = (aImag*x1 - aReal)*x2;
      }
    }
    break;
  case C_SCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((SingleComplex*)pA)[i].real;
      bReal = ((SingleComplex*)pB)[i].real;
      aImag = ((SingleComplex*)pA)[i].imag;
      bImag = ((SingleComplex*)pB)[i].imag;
      /* 
        The following original algorithm overflows
	when it need not.
      temp = bReal*bReal+bImag*bImag;
      if(temp!=0.0){
	((SingleComplex*)pC)[i].real
	  =(aReal*bReal+aImag*bImag)/temp;
	((SingleComplex*)pC)[i].imag
	  =(aImag*bReal-aReal*bImag)/temp;
      }
      else{
	pnga_error("zero divisor ",temp); 
      }
      */
      if (GA_ABS(bReal) >= GA_ABS(bImag)) {
	if (bReal != (float)0.0) {
	  x1 = bImag/bReal;
          /* So x1 <= 1 */
	  x2 = ((float)1.0)/(bReal*(((float)1.0)+(x1*x1)));
	  ((SingleComplex*)pC)[i].real = (aReal + aImag*x1)*x2;
	  ((SingleComplex*)pC)[i].imag = (aImag - aReal*x1)*x2;
	}
	else{
	  pnga_error("zero divisor ",bReal); 
	}
      } else {
	x1 = bReal/bImag;
        /* So x1 <= 1 */
	x2 = ((float)1.0)/(bImag*(((float)1.0)+(x1*x1)));
	((SingleComplex*)pC)[i].real = (aReal*x1 + aImag)*x2;
	((SingleComplex*)pC)[i].imag = (aImag*x1 - aReal)*x2;
      }
    }
    break;
  case C_INT:
    for(i = 0; i<nelems; i++){
      if(((int*)pB)[i]!=0)
	((int*)pC)[i] = ((int*)pA)[i]/((int*)pB)[i];
      else{
	pnga_error("zero divisor ",((int*)pB)[i]); 
      } 
    }
    break;
  case C_FLOAT:
    for(i = 0; i<nelems; i++){
      if(((float*)pB)[i]!=(float)0.0) 
	((float*)pC)[i]=  ((float*)pA)[i]/((float*)pB)[i];
      else{
	pnga_error("zero divisor ",((float*)pB)[i]); 
      }
    }
    break;
  case C_LONG:
    for(i = 0; i<nelems; i++){
      if(((long *)pB)[i]!=0)
	((long *)pC)[i]=  ((long *)pA)[i]/((long *)pB)[i];
      else{
	pnga_error("zero divisor ",((long*)pB)[i]); 
      }
    }
    break;		
  default: pnga_error(" wrong data type ",type);
  }
}